

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O3

int test_kvtree_util_set_get_ptr(void)

{
  int iVar1;
  long lVar2;
  int rc;
  void *roundtrip;
  kvtree *kvtree;
  int local_24;
  int *local_20;
  long local_18;
  
  local_24 = 0;
  local_20 = (int *)0x0;
  lVar2 = kvtree_new();
  if (lVar2 == 0) {
    local_24 = 1;
  }
  local_18 = lVar2;
  iVar1 = kvtree_util_set_ptr(lVar2,"KEY",&local_24);
  if (iVar1 != 0) {
    local_24 = 1;
  }
  iVar1 = kvtree_util_get_ptr(lVar2,"KEY",&local_20);
  if (iVar1 != 0) {
    local_24 = 1;
  }
  if (local_20 != &local_24) {
    local_24 = 1;
  }
  kvtree_delete(&local_18);
  return local_24;
}

Assistant:

int test_kvtree_util_set_get_ptr(){
  int rc = TEST_PASS;
  char* key = "KEY";
  void* value = (void*) &rc; /* any memory pointer will do, just use address of rc */
  void* roundtrip = NULL;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_ptr(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_ptr(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}